

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O0

bool check_qclab_qgates_RotationY<float>
               (vector<float,_std::allocator<float>_> *v1,vector<float,_std::allocator<float>_> *v2)

{
  size_type sVar1;
  size_type sVar2;
  vector<float,_std::allocator<float>_> *pvVar3;
  float extraout_XMM0_Da;
  ulong local_30;
  size_t i;
  R tol;
  vector<float,_std::allocator<float>_> *v2_local;
  vector<float,_std::allocator<float>_> *v1_local;
  
  std::numeric_limits<float>::epsilon();
  sVar1 = std::vector<float,_std::allocator<float>_>::size(v1);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(v2);
  if (sVar1 != sVar2) {
    __assert_fail("v1.size() == v2.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationY.cpp"
                  ,0xb,
                  "bool check_qclab_qgates_RotationY(const std::vector<T> &, const std::vector<T> &) [T = float]"
                 );
  }
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(v1);
    if (sVar1 <= local_30) {
      return true;
    }
    std::vector<float,_std::allocator<float>_>::operator[](v1,local_30);
    pvVar3 = v2;
    std::vector<float,_std::allocator<float>_>::operator[](v2,local_30);
    std::abs((int)pvVar3);
    if (1.1920929e-05 < extraout_XMM0_Da) break;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool check_qclab_qgates_RotationY( const std::vector< T >& v1 ,
                                   const std::vector< T >& v2 ) {

  using R = qclab::real_t< T > ;
  const R tol = 100 * std::numeric_limits< R >::epsilon() ;

  assert( v1.size() == v2.size() ) ;
  for ( size_t i = 0; i < v1.size(); ++i ) {
    if ( std::abs( v1[i] - v2[i] ) > tol ) return false ;
  }
  return true ;

}